

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExtraCodeLiteGenerator.h
# Opt level: O1

string * __thiscall cmExtraCodeLiteGenerator::GetName_abi_cxx11_(cmExtraCodeLiteGenerator *this)

{
  string *in_RDI;
  
  (in_RDI->_M_dataplus)._M_p = (pointer)&in_RDI->field_2;
  (in_RDI->field_2)._M_allocated_capacity = 0x6574694c65646f43;
  in_RDI->_M_string_length = 8;
  (in_RDI->field_2)._M_local_buf[8] = '\0';
  return in_RDI;
}

Assistant:

virtual std::string GetName() const
                          { return cmExtraCodeLiteGenerator::GetActualName();}